

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::FileGenerator::PrintFileRuntimePreamble
          (FileGenerator *this,Printer *printer,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *headers_to_import)

{
  string *args_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *headers_to_import_local;
  Printer *printer_local;
  FileGenerator *this_local;
  
  args_1 = FileDescriptor::name_abi_cxx11_(this->file_);
  io::Printer::Print<char[9],std::__cxx11::string>
            (printer,
             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
             ,(char (*) [9])"filename",args_1);
  ImportWriter::PrintRuntimeImports
            (printer,headers_to_import,&(this->options_).runtime_import_prefix,true);
  io::Printer::Print<>(printer,"\n");
  return;
}

Assistant:

void FileGenerator::PrintFileRuntimePreamble(
    io::Printer* printer,
    const std::vector<std::string>& headers_to_import) const {
  printer->Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// source: $filename$\n"
      "\n",
      "filename", file_->name());
  ImportWriter::PrintRuntimeImports(
      printer, headers_to_import, options_.runtime_import_prefix, true);
  printer->Print("\n");
}